

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9762:37)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9762:37)>
          *this,string *arg)

{
  long lVar1;
  bool bVar2;
  YesOrNo YVar3;
  long in_FS_OFFSET;
  BasicResult<Catch::clara::detail::ParseResultType> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string mode;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)&temp);
  local_d0.m_errorMessage._M_dataplus._M_p = (pointer)&local_d0.m_errorMessage.field_2;
  local_d0.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type = Ok
  ;
  local_d0.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_d0.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001e2768;
  local_d0.m_errorMessage._M_string_length = 0;
  local_d0.m_errorMessage.field_2._M_local_buf[0] = '\0';
  toLower(&mode,&temp);
  bVar2 = ::std::operator==(&mode,"yes");
  if (bVar2) {
    YVar3 = Yes;
  }
  else {
    bVar2 = ::std::operator==(&mode,"no");
    if (bVar2) {
      YVar3 = No;
    }
    else {
      bVar2 = ::std::operator==(&mode,"auto");
      YVar3 = Auto;
      if (!bVar2) {
        ::std::operator+(&local_80,"colour mode must be one of: auto, yes or no. \'",&temp);
        ::std::operator+(&local_60,&local_80,"\' not recognised");
        BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
                  (__return_storage_ptr__,&local_60);
        ::std::__cxx11::string::~string((string *)&local_60);
        ::std::__cxx11::string::~string((string *)&local_80);
        goto LAB_0018fe45;
      }
    }
  }
  ((this->m_lambda).config)->useColour = YVar3;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001e2768;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0018fe45:
  ::std::__cxx11::string::~string((string *)&mode);
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_d0);
  ::std::__cxx11::string::~string((string *)&temp);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }